

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::ImmediatePromiseNode<kj::_::Void>_>
kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>(Void *params)

{
  ImmediatePromiseNode<kj::_::Void> *pIVar1;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar2;
  ExceptionOr<kj::_::Void> local_178;
  
  pIVar1 = (ImmediatePromiseNode<kj::_::Void> *)operator_new(0x170);
  local_178.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_178.value.ptr.isSet = true;
  _::ImmediatePromiseNode<kj::_::Void>::ImmediatePromiseNode(pIVar1,&local_178);
  *(undefined8 **)params = &_::HeapDisposer<kj::_::ImmediatePromiseNode<kj::_::Void>>::instance;
  *(ImmediatePromiseNode<kj::_::Void> **)(params + 8) = pIVar1;
  pIVar1 = extraout_RDX;
  if (local_178.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.super_ExceptionOrValue.exception.ptr.field_1.value);
    pIVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pIVar1;
  OVar2.disposer = (Disposer *)params;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}